

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O3

void stats_print_helper(emitter_t *emitter,_Bool merged,_Bool destroyed,_Bool unmerged,_Bool bins,
                       _Bool large,_Bool mutex,_Bool extents,_Bool hpa)

{
  tsd_t *tsd;
  long lVar1;
  size_t sVar2;
  undefined1 auVar3 [8];
  int iVar4;
  tsd_t *ptVar5;
  long lVar6;
  undefined1 *puVar7;
  undefined1 *puVar8;
  undefined1 *puVar9;
  char *format;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  char *pcVar13;
  emitter_justify_t *peVar14;
  long *in_FS_OFFSET;
  bool bVar15;
  ulong uStack_340;
  undefined1 local_338 [8];
  size_t sz;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_328 [4];
  undefined4 local_308;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_300;
  undefined4 local_2e0;
  ulong local_2d8 [4];
  undefined4 local_2b8;
  ulong local_2b0;
  undefined4 local_290;
  ulong local_288 [4];
  undefined4 local_268;
  ulong local_260;
  undefined4 local_240;
  ulong local_238 [4];
  undefined4 local_218;
  ulong local_210;
  undefined4 local_1f0;
  ulong local_1e8 [4];
  undefined4 local_1c8;
  ulong local_1c0;
  undefined4 local_1a0;
  undefined1 local_198 [24];
  undefined1 local_180 [8];
  emitter_col_t name;
  emitter_col_t col32 [1];
  size_t local_128;
  size_t stats_mutexes_mib [7];
  size_t mapped;
  size_t retained;
  size_t zero_reallocs;
  uint64_t uptime;
  undefined8 local_c8;
  size_t allocated;
  size_t active;
  size_t metadata;
  size_t metadata_edata;
  size_t metadata_rtree;
  size_t metadata_thp;
  size_t resident;
  size_t num_background_threads;
  uint64_t background_thread_num_runs;
  uint64_t background_thread_run_interval;
  emitter_row_t row;
  size_t local_40;
  size_t sz_13;
  size_t miblen;
  
  puVar8 = local_338;
  puVar7 = local_338;
  puVar9 = local_338;
  local_338 = (undefined1  [8])0x8;
  uStack_340 = 0x1f18d2;
  iVar4 = duckdb_je_mallctl("stats.allocated",&local_c8,(size_t *)local_338,(void *)0x0,0);
  if (iVar4 != 0) {
    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar13 = "stats.allocated";
    goto LAB_001f2b99;
  }
  local_338 = (undefined1  [8])0x8;
  uStack_340 = 0x1f1900;
  iVar4 = duckdb_je_mallctl("stats.active",&allocated,(size_t *)local_338,(void *)0x0,0);
  if (iVar4 != 0) {
    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar13 = "stats.active";
    puVar9 = local_338;
    goto LAB_001f2b99;
  }
  local_338 = (undefined1  [8])0x8;
  uStack_340 = 0x1f192e;
  iVar4 = duckdb_je_mallctl("stats.metadata",&active,(size_t *)local_338,(void *)0x0,0);
  if (iVar4 != 0) {
    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar13 = "stats.metadata";
    puVar9 = local_338;
    goto LAB_001f2b99;
  }
  local_338 = (undefined1  [8])0x8;
  uStack_340 = 0x1f195c;
  iVar4 = duckdb_je_mallctl("stats.metadata_edata",&metadata,(size_t *)local_338,(void *)0x0,0);
  if (iVar4 != 0) {
    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar13 = "stats.metadata_edata";
    puVar9 = local_338;
    goto LAB_001f2b99;
  }
  local_338 = (undefined1  [8])0x8;
  uStack_340 = 0x1f198a;
  iVar4 = duckdb_je_mallctl("stats.metadata_rtree",&metadata_edata,(size_t *)local_338,(void *)0x0,0
                           );
  if (iVar4 != 0) {
    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar13 = "stats.metadata_rtree";
    puVar9 = local_338;
    goto LAB_001f2b99;
  }
  local_338 = (undefined1  [8])0x8;
  uStack_340 = 0x1f19b8;
  iVar4 = duckdb_je_mallctl("stats.metadata_thp",&metadata_rtree,(size_t *)local_338,(void *)0x0,0);
  if (iVar4 != 0) {
    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar13 = "stats.metadata_thp";
    puVar9 = local_338;
    goto LAB_001f2b99;
  }
  local_338 = (undefined1  [8])0x8;
  uStack_340 = 0x1f19e6;
  iVar4 = duckdb_je_mallctl("stats.resident",&metadata_thp,(size_t *)local_338,(void *)0x0,0);
  if (iVar4 != 0) {
    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar13 = "stats.resident";
    puVar9 = local_338;
    goto LAB_001f2b99;
  }
  local_338 = (undefined1  [8])0x8;
  uStack_340 = 0x1f1a14;
  iVar4 = duckdb_je_mallctl("stats.mapped",stats_mutexes_mib + 6,(size_t *)local_338,(void *)0x0,0);
  if (iVar4 != 0) {
    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar13 = "stats.mapped";
    puVar9 = local_338;
    goto LAB_001f2b99;
  }
  local_338 = (undefined1  [8])0x8;
  uStack_340 = 0x1f1a42;
  iVar4 = duckdb_je_mallctl("stats.retained",&mapped,(size_t *)local_338,(void *)0x0,0);
  if (iVar4 != 0) {
    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar13 = "stats.retained";
    puVar9 = local_338;
    goto LAB_001f2b99;
  }
  local_338 = (undefined1  [8])0x8;
  uStack_340 = 0x1f1a70;
  iVar4 = duckdb_je_mallctl("stats.zero_reallocs",&retained,(size_t *)local_338,(void *)0x0,0);
  if (iVar4 != 0) {
    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar13 = "stats.zero_reallocs";
    puVar9 = local_338;
    goto LAB_001f2b99;
  }
  local_338 = (undefined1  [8])0x8;
  uStack_340 = 0x1f1a9e;
  iVar4 = duckdb_je_mallctl("stats.background_thread.num_threads",&resident,(size_t *)local_338,
                            (void *)0x0,0);
  if (iVar4 != 0) {
    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar13 = "stats.background_thread.num_threads";
    puVar9 = local_338;
    goto LAB_001f2b99;
  }
  local_338 = (undefined1  [8])0x8;
  uStack_340 = 0x1f1ac9;
  iVar4 = duckdb_je_mallctl("stats.background_thread.num_runs",&num_background_threads,
                            (size_t *)local_338,(void *)0x0,0);
  if (iVar4 != 0) {
    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar13 = "stats.background_thread.num_runs";
    puVar9 = local_338;
    goto LAB_001f2b99;
  }
  local_338 = (undefined1  [8])0x8;
  uStack_340 = 0x1f1af8;
  iVar4 = duckdb_je_mallctl("stats.background_thread.run_interval",&background_thread_num_runs,
                            (size_t *)local_338,(void *)0x0,0);
  if (iVar4 != 0) {
    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar13 = "stats.background_thread.run_interval";
    puVar9 = local_338;
    goto LAB_001f2b99;
  }
  uStack_340 = 0x1f1b0f;
  emitter_json_object_kv_begin(emitter,"stats");
  uStack_340 = 0x1f1b2c;
  emitter_json_kv(emitter,"allocated",emitter_type_size,&local_c8);
  uStack_340 = 0x1f1b45;
  emitter_json_kv(emitter,"active",emitter_type_size,&allocated);
  uStack_340 = 0x1f1b5e;
  emitter_json_kv(emitter,"metadata",emitter_type_size,&active);
  uStack_340 = 0x1f1b77;
  emitter_json_kv(emitter,"metadata_edata",emitter_type_size,&metadata);
  uStack_340 = 0x1f1b90;
  emitter_json_kv(emitter,"metadata_rtree",emitter_type_size,&metadata_edata);
  uStack_340 = 0x1f1ba9;
  emitter_json_kv(emitter,"metadata_thp",emitter_type_size,&metadata_rtree);
  uStack_340 = 0x1f1bc2;
  emitter_json_kv(emitter,"resident",emitter_type_size,&metadata_thp);
  uStack_340 = 0x1f1bde;
  emitter_json_kv(emitter,"mapped",emitter_type_size,stats_mutexes_mib + 6);
  uStack_340 = 0x1f1bfa;
  emitter_json_kv(emitter,"retained",emitter_type_size,&mapped);
  uStack_340 = 0x1f1c16;
  emitter_json_kv(emitter,"zero_reallocs",emitter_type_size,&retained);
  emitter_table_printf
            (emitter,
             "Allocated: %zu, active: %zu, metadata: %zu (n_thp %zu, edata %zu, rtree %zu), resident: %zu, mapped: %zu, retained: %zu\n"
             ,local_c8,allocated,active,metadata_rtree,metadata,metadata_edata,metadata_thp);
  uStack_340 = 0x1f1c91;
  emitter_table_printf(emitter,"Count of realloc(non-null-ptr, 0) calls: %zu\n",retained);
  uStack_340 = 0x1f1ca0;
  emitter_json_object_kv_begin(emitter,"background_thread");
  uStack_340 = 0x1f1cb9;
  emitter_json_kv(emitter,"num_threads",emitter_type_size,&resident);
  uStack_340 = 0x1f1cd3;
  emitter_json_kv(emitter,"num_runs",emitter_type_uint64,&num_background_threads);
  uStack_340 = 0x1f1ce9;
  emitter_json_kv(emitter,"run_interval",emitter_type_uint64,&background_thread_num_runs);
  if (emitter->output < emitter_output_table) {
    emitter->nesting_depth = emitter->nesting_depth + -1;
    emitter->item_at_depth = true;
    if (emitter->output != emitter_output_json_compact) {
      uStack_340 = 0x1f1d11;
      emitter_printf(emitter,anon_var_dwarf_64382b4 + 8);
      pcVar13 = anon_var_dwarf_6438689 + 7;
      if (emitter->output != emitter_output_json) {
        pcVar13 = " ";
      }
      if (0 < emitter->nesting_depth) {
        iVar4 = emitter->nesting_depth << (emitter->output != emitter_output_json);
        if (iVar4 < 2) {
          iVar4 = 1;
        }
        do {
          uStack_340 = 0x1f1d57;
          emitter_printf(emitter,"%s",pcVar13);
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
    }
    uStack_340 = 0x1f1d6d;
    emitter_printf(emitter,"}");
  }
  uStack_340 = 0x1f1d8d;
  emitter_table_printf
            (emitter,"Background threads: %zu, num_runs: %lu, run_interval: %lu ns\n",resident);
  if (mutex) {
    background_thread_run_interval = 0;
    uStack_340 = 0x1f1dc0;
    mutex_stats_init_cols
              ((emitter_row_t *)&background_thread_run_interval,anon_var_dwarf_643837b + 9,
               (emitter_col_t *)local_180,(emitter_col_t *)local_338,
               (emitter_col_t *)&name.link.qre_prev);
    if (emitter->output == emitter_output_table) {
      peVar14 = (emitter_justify_t *)background_thread_run_interval;
      if (background_thread_run_interval != 0) {
        do {
          uStack_340 = 0x1f1de5;
          emitter_print_value(emitter,*peVar14,peVar14[1],peVar14[2],peVar14 + 4);
          peVar14 = *(emitter_justify_t **)(peVar14 + 6);
          if (peVar14 == (emitter_justify_t *)0x0) break;
        } while (peVar14 != (emitter_justify_t *)background_thread_run_interval);
      }
      uStack_340 = 0x1f1e05;
      emitter_table_printf(emitter,anon_var_dwarf_64382b4 + 8);
    }
    uStack_340 = 0x1f1e14;
    emitter_json_object_kv_begin(emitter,"mutexes");
    sz_13 = 7;
    local_40 = 8;
    uStack_340 = 0x1f1e3a;
    iVar4 = duckdb_je_mallctlnametomib("stats.arenas.0.uptime",&local_128,&sz_13);
    if (iVar4 != 0) {
      format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
      pcVar13 = "stats.arenas.0.uptime";
      puVar9 = local_338;
      goto LAB_001f2b99;
    }
    stats_mutexes_mib[1] = 0;
    uStack_340 = 0x1f1e68;
    iVar4 = duckdb_je_mallctlbymib(&local_128,sz_13,&zero_reallocs,&local_40,(void *)0x0,0);
    if (iVar4 == 0) {
      sz_13 = 7;
      lVar1 = *in_FS_OFFSET;
      tsd = (tsd_t *)(lVar1 + -0x2a90);
      ptVar5 = tsd;
      if (*(char *)(lVar1 + -0x2758) != '\0') {
        uStack_340 = 0x1f2a5b;
        ptVar5 = duckdb_je_tsd_fetch_slow(tsd,false);
      }
      uStack_340 = 0x1f1eb4;
      iVar4 = duckdb_je_ctl_mibnametomib(ptVar5,&local_128,0,"stats.mutexes",&sz_13);
      if (iVar4 != 0) {
LAB_001f2a74:
        pcVar13 = "<jemalloc>: Failure in ctl_mibnametomib()\n";
        goto LAB_001f2a6a;
      }
      lVar6 = 0;
      do {
        sVar2 = zero_reallocs;
        pcVar13 = duckdb_je_global_mutex_names[lVar6];
        sz_13 = 7;
        ptVar5 = tsd;
        if (*(char *)(lVar1 + -0x2758) != '\0') {
          uStack_340 = 0x1f245c;
          ptVar5 = duckdb_je_tsd_fetch_slow(tsd,false);
        }
        uStack_340 = 0x1f1f09;
        iVar4 = duckdb_je_ctl_mibnametomib(ptVar5,&local_128,2,pcVar13,&sz_13);
        if (iVar4 != 0) goto LAB_001f2a74;
        sz = CONCAT44(sz._4_4_,5);
        sz_13 = 7;
        local_40 = 8;
        ptVar5 = tsd;
        name._8_8_ = pcVar13;
        if (*(char *)(lVar1 + -0x2758) != '\0') {
          uStack_340 = 0x1f246e;
          ptVar5 = duckdb_je_tsd_fetch_slow(tsd,false);
        }
        iVar4 = duckdb_je_ctl_bymibname
                          (ptVar5,&local_128,3,"num_ops",&sz_13,local_328,&local_40,(void *)0x0,0);
        if (iVar4 != 0) {
LAB_001f2a63:
          pcVar13 = "<jemalloc>: Failure in ctl_bymibname()\n";
          puVar7 = local_338;
          goto LAB_001f2a6a;
        }
        local_308 = 5;
        if (local_328[0].uint64_val == 0 || sVar2 == 0) {
          local_300.uint64_val = 0;
        }
        else {
          local_300 = local_328[0];
          if (999999999 < sVar2) {
            local_300.uint64_val = local_328[0].uint64_val / (sVar2 / 1000000000);
          }
        }
        local_2e0 = 5;
        sz_13 = 7;
        local_40 = 8;
        ptVar5 = tsd;
        if (*(char *)(lVar1 + -0x2758) != '\0') {
          uStack_340 = 0x1f2480;
          ptVar5 = duckdb_je_tsd_fetch_slow(tsd,false);
        }
        iVar4 = duckdb_je_ctl_bymibname
                          (ptVar5,&local_128,3,"num_wait",&sz_13,local_2d8,&local_40,(void *)0x0,0);
        if (iVar4 != 0) goto LAB_001f2a63;
        local_2b8 = 5;
        if (local_2d8[0] == 0 || sVar2 == 0) {
          local_2b0 = 0;
        }
        else {
          local_2b0 = local_2d8[0];
          if (999999999 < sVar2) {
            local_2b0 = local_2d8[0] / (sVar2 / 1000000000);
          }
        }
        local_290 = 5;
        sz_13 = 7;
        local_40 = 8;
        ptVar5 = tsd;
        if (*(char *)(lVar1 + -0x2758) != '\0') {
          uStack_340 = 0x1f2492;
          ptVar5 = duckdb_je_tsd_fetch_slow(tsd,false);
        }
        iVar4 = duckdb_je_ctl_bymibname
                          (ptVar5,&local_128,3,"num_spin_acq",&sz_13,local_288,&local_40,(void *)0x0
                           ,0);
        if (iVar4 != 0) goto LAB_001f2a63;
        local_268 = 5;
        if (local_288[0] == 0 || sVar2 == 0) {
          local_260 = 0;
        }
        else {
          local_260 = local_288[0];
          if (999999999 < sVar2) {
            local_260 = local_288[0] / (sVar2 / 1000000000);
          }
        }
        local_240 = 5;
        sz_13 = 7;
        local_40 = 8;
        ptVar5 = tsd;
        if (*(char *)(lVar1 + -0x2758) != '\0') {
          uStack_340 = 0x1f24a4;
          ptVar5 = duckdb_je_tsd_fetch_slow(tsd,false);
        }
        iVar4 = duckdb_je_ctl_bymibname
                          (ptVar5,&local_128,3,"num_owner_switch",&sz_13,local_238,&local_40,
                           (void *)0x0,0);
        if (iVar4 != 0) goto LAB_001f2a63;
        local_218 = 5;
        if (local_238[0] == 0 || sVar2 == 0) {
          local_210 = 0;
        }
        else {
          local_210 = local_238[0];
          if (999999999 < sVar2) {
            local_210 = local_238[0] / (sVar2 / 1000000000);
          }
        }
        local_1f0 = 5;
        sz_13 = 7;
        local_40 = 8;
        ptVar5 = tsd;
        if (*(char *)(lVar1 + -0x2758) != '\0') {
          uStack_340 = 0x1f24b6;
          ptVar5 = duckdb_je_tsd_fetch_slow(tsd,false);
        }
        iVar4 = duckdb_je_ctl_bymibname
                          (ptVar5,&local_128,3,"total_wait_time",&sz_13,local_1e8,&local_40,
                           (void *)0x0,0);
        if (iVar4 != 0) goto LAB_001f2a63;
        local_1c8 = 5;
        if (local_1e8[0] == 0 || sVar2 == 0) {
          local_1c0 = 0;
        }
        else {
          local_1c0 = local_1e8[0];
          if (999999999 < sVar2) {
            local_1c0 = local_1e8[0] / (sVar2 / 1000000000);
          }
        }
        local_1a0 = 5;
        sz_13 = 7;
        local_40 = 8;
        ptVar5 = tsd;
        if (*(char *)(lVar1 + -0x2758) != '\0') {
          uStack_340 = 0x1f24c8;
          ptVar5 = duckdb_je_tsd_fetch_slow(tsd,false);
        }
        iVar4 = duckdb_je_ctl_bymibname
                          (ptVar5,&local_128,3,"max_wait_time",&sz_13,local_198,&local_40,
                           (void *)0x0,0);
        if (iVar4 != 0) goto LAB_001f2a63;
        col32[0].justify = 4;
        sz_13 = 7;
        local_40 = 4;
        ptVar5 = tsd;
        if (*(char *)(lVar1 + -0x2758) != '\0') {
          uStack_340 = 0x1f24da;
          ptVar5 = duckdb_je_tsd_fetch_slow(tsd,false);
        }
        iVar4 = duckdb_je_ctl_bymibname
                          (ptVar5,&local_128,3,"max_num_thds",&sz_13,&col32[0].type,&local_40,
                           (void *)0x0,0);
        if (iVar4 != 0) goto LAB_001f2a63;
        uStack_340 = 0x1f238e;
        emitter_json_object_kv_begin(emitter,pcVar13);
        uStack_340 = 0x1f23a8;
        mutex_stats_emit(emitter,(emitter_row_t *)&background_thread_run_interval,
                         (emitter_col_t *)local_338,(emitter_col_t *)&name.link.qre_prev);
        if (emitter->output < emitter_output_table) {
          emitter->nesting_depth = emitter->nesting_depth + -1;
          emitter->item_at_depth = true;
          if (emitter->output != emitter_output_json_compact) {
            uStack_340 = 0x1f23da;
            emitter_printf(emitter,anon_var_dwarf_64382b4 + 8);
            pcVar13 = anon_var_dwarf_6438689 + 7;
            if (emitter->output != emitter_output_json) {
              pcVar13 = " ";
            }
            if (0 < emitter->nesting_depth) {
              iVar4 = emitter->nesting_depth << (emitter->output != emitter_output_json);
              if (iVar4 < 2) {
                iVar4 = 1;
              }
              do {
                uStack_340 = 0x1f241d;
                emitter_printf(emitter,"%s",pcVar13);
                iVar4 = iVar4 + -1;
              } while (iVar4 != 0);
            }
          }
          uStack_340 = 0x1f2433;
          emitter_printf(emitter,"}");
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 9);
      if (emitter->output < emitter_output_table) {
        emitter->nesting_depth = emitter->nesting_depth + -1;
        emitter->item_at_depth = true;
        pcVar13 = anon_var_dwarf_6438689 + 7;
        if (emitter->output != emitter_output_json_compact) {
          uStack_340 = 0x1f2511;
          emitter_printf(emitter,anon_var_dwarf_64382b4 + 8);
          if (emitter->output != emitter_output_json) {
            pcVar13 = " ";
          }
          if (0 < emitter->nesting_depth) {
            iVar4 = emitter->nesting_depth << (emitter->output != emitter_output_json);
            if (iVar4 < 2) {
              iVar4 = 1;
            }
            do {
              uStack_340 = 0x1f2550;
              emitter_printf(emitter,"%s",pcVar13);
              iVar4 = iVar4 + -1;
            } while (iVar4 != 0);
          }
        }
        uStack_340 = 0x1f2566;
        emitter_printf(emitter,"}");
      }
      goto LAB_001f2566;
    }
  }
  else {
LAB_001f2566:
    uVar11 = 1;
    if (emitter->output < emitter_output_table) {
      emitter->nesting_depth = emitter->nesting_depth + -1;
      emitter->item_at_depth = true;
      if (emitter->output != emitter_output_json_compact) {
        uStack_340 = 0x1f258a;
        emitter_printf(emitter,anon_var_dwarf_64382b4 + 8);
        pcVar13 = anon_var_dwarf_6438689 + 7;
        if (emitter->output != emitter_output_json) {
          pcVar13 = " ";
        }
        if (0 < emitter->nesting_depth) {
          iVar4 = emitter->nesting_depth << (emitter->output != emitter_output_json);
          if (iVar4 < 2) {
            iVar4 = 1;
          }
          do {
            uStack_340 = 0x1f25d0;
            emitter_printf(emitter,"%s",pcVar13);
            iVar4 = iVar4 + -1;
          } while (iVar4 != 0);
        }
      }
      uStack_340 = 0x1f25e6;
      emitter_printf(emitter,"}");
    }
    if ((!merged && !destroyed) && !unmerged) {
      return;
    }
    uStack_340 = 0x1f2606;
    emitter_json_object_kv_begin(emitter,"stats.arenas");
    local_338 = (undefined1  [8])0x4;
    uStack_340 = 0x1f2629;
    iVar4 = duckdb_je_mallctl("arenas.narenas",&sz_13,(size_t *)local_338,(void *)0x0,0);
    if (iVar4 != 0) {
      format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
      pcVar13 = "arenas.narenas";
      puVar9 = local_338;
LAB_001f2b99:
      *(undefined8 *)(puVar9 + -8) = 0x1f2ba0;
      duckdb_je_malloc_printf(format,pcVar13);
      *(code **)(puVar9 + -8) = stats_arena_print;
      abort();
    }
    local_180 = (undefined1  [8])0x3;
    lVar1 = -((sz_13 & 0xffffffff) + 0xf & 0xfffffffffffffff0);
    puVar8 = local_338 + lVar1;
    uptime = (uint64_t)local_338;
    *(undefined8 *)((long)&uStack_340 + lVar1) = 0x1f2671;
    iVar4 = duckdb_je_mallctlnametomib
                      ("arena.0.initialized",(size_t *)local_338,(size_t *)local_180);
    if (iVar4 != 0) {
      format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
      pcVar13 = "arena.0.initialized";
      puVar9 = puVar8;
      goto LAB_001f2b99;
    }
    if ((uint)sz_13 == 0) {
      bVar15 = true;
    }
    else {
      uVar11 = 0;
      uVar12 = 0;
      do {
        auVar3 = local_180;
        name.link.qre_prev = (emitter_col_t *)&DAT_00000001;
        sz = uVar11;
        *(undefined8 *)((long)&uStack_340 + lVar1) = 0x1f26c5;
        iVar4 = duckdb_je_mallctlbymib
                          ((size_t *)local_338,(size_t)auVar3,puVar8 + uVar11,
                           (size_t *)&name.link.qre_prev,(void *)0x0,0);
        if (iVar4 != 0) goto LAB_001f2a7d;
        uVar12 = uVar12 + (byte)puVar8[uVar11];
        uVar11 = uVar11 + 1;
      } while (uVar11 < (sz_13 & 0xffffffff));
      bVar15 = uVar12 < 2;
      *(undefined8 *)((long)&uStack_340 + lVar1) = 1;
      uVar11 = *(ulong *)((long)&uStack_340 + lVar1);
    }
    auVar3 = local_180;
    sz = 0x1001;
    name.link.qre_prev = (emitter_col_t *)&DAT_00000001;
    *(undefined8 *)((long)&uStack_340 + lVar1) = 0x1f2724;
    iVar4 = duckdb_je_mallctlbymib
                      ((size_t *)local_338,(size_t)auVar3,&local_40,(size_t *)&name.link.qre_prev,
                       (void *)0x0,0);
    if (iVar4 == 0) {
      row.cols.qlh_first._1_7_ = 0;
      row.cols.qlh_first._0_1_ = hpa;
      if ((merged) && ((bVar15 & unmerged) == 0)) {
        *(undefined8 *)((long)&uStack_340 + lVar1) = 0x1f2942;
        emitter_table_printf(emitter,"Merged arenas stats:\n");
        *(undefined8 *)((long)&uStack_340 + lVar1) = 0x1f2951;
        emitter_json_object_kv_begin(emitter,"merged");
        ((anon_struct_8_1_803fbc3e_for_cols *)((long)local_328 + lVar1 + -0x20))->qlh_first =
             (emitter_col_t *)row.cols.qlh_first;
        *(undefined8 *)(&stack0xfffffffffffffcb0 + lVar1) = 0x1f2973;
        stats_arena_print(emitter,0x1000,bins,large,mutex,extents,
                          *(_Bool *)((long)local_328 + lVar1 + -0x20));
        *(undefined8 *)((long)&uStack_340 + lVar1) = 0x1f297d;
        emitter_json_object_end(emitter);
      }
      if ((destroyed & (byte)local_40) == 1) {
        *(undefined8 *)((long)&uStack_340 + lVar1) = 0x1f2993;
        emitter_table_printf(emitter,"Destroyed arenas stats:\n");
        *(undefined8 *)((long)&uStack_340 + lVar1) = 0x1f29a2;
        emitter_json_object_kv_begin(emitter,"destroyed");
        ((anon_struct_8_1_803fbc3e_for_cols *)((long)local_328 + lVar1 + -0x20))->qlh_first =
             (emitter_col_t *)row.cols.qlh_first;
        *(undefined8 *)(&stack0xfffffffffffffcb0 + lVar1) = 0x1f29c4;
        stats_arena_print(emitter,0x1001,bins,large,mutex,extents,
                          *(_Bool *)((long)local_328 + lVar1 + -0x20));
        if (emitter->output < emitter_output_table) {
          emitter->nesting_depth = emitter->nesting_depth + -1;
          emitter->item_at_depth = true;
          if (emitter->output != emitter_output_json_compact) {
            *(undefined8 *)((long)&uStack_340 + lVar1) = 0x1f29f0;
            emitter_printf(emitter,anon_var_dwarf_64382b4 + 8);
            pcVar13 = anon_var_dwarf_6438689 + 7;
            if (emitter->output != emitter_output_json) {
              pcVar13 = " ";
            }
            if (0 < emitter->nesting_depth) {
              uVar12 = emitter->nesting_depth << (emitter->output != emitter_output_json);
              uVar10 = (ulong)uVar12;
              if ((int)uVar12 < 2) {
                uVar10 = uVar11 & 0xffffffff;
              }
              do {
                *(undefined8 *)((long)&uStack_340 + lVar1) = 0x1f2a36;
                emitter_printf(emitter,"%s",pcVar13);
                uVar12 = (int)uVar10 - 1;
                uVar10 = (ulong)uVar12;
              } while (uVar12 != 0);
            }
          }
          *(undefined8 *)((long)&uStack_340 + lVar1) = 0x1f2a4c;
          emitter_printf(emitter,"}");
        }
      }
      if (unmerged && (uint)sz_13 != 0) {
        uVar10 = 0;
        uVar12 = (uint)sz_13;
        do {
          if (puVar8[uVar10] == '\x01') {
            *(undefined8 *)((long)&uStack_340 + lVar1) = 0x14;
            sVar2 = *(size_t *)((long)&uStack_340 + lVar1);
            *(undefined8 *)((long)&uStack_340 + lVar1) = 0x1f27c2;
            duckdb_je_malloc_snprintf((char *)&local_128,sVar2,"%u",uVar10 & 0xffffffff);
            *(undefined8 *)((long)&uStack_340 + lVar1) = 0x1f27cd;
            emitter_json_object_kv_begin(emitter,(char *)&local_128);
            *(undefined8 *)((long)&uStack_340 + lVar1) = 0x1f27e8;
            emitter_table_printf(emitter,"arenas[%s]:\n",&local_128);
            ((anon_struct_8_1_803fbc3e_for_cols *)((long)local_328 + lVar1 + -0x20))->qlh_first =
                 (emitter_col_t *)row.cols.qlh_first;
            *(undefined8 *)(&stack0xfffffffffffffcb0 + lVar1) = 0x1f2808;
            stats_arena_print(emitter,(uint)uVar10,bins,large,mutex,extents,
                              *(_Bool *)((long)local_328 + lVar1 + -0x20));
            if (emitter->output < emitter_output_table) {
              emitter->nesting_depth = emitter->nesting_depth + -1;
              emitter->item_at_depth = true;
              if (emitter->output != emitter_output_json_compact) {
                *(undefined8 *)((long)&uStack_340 + lVar1) = 0x1f2834;
                emitter_printf(emitter,anon_var_dwarf_64382b4 + 8);
                pcVar13 = anon_var_dwarf_6438689 + 7;
                if (emitter->output != emitter_output_json) {
                  pcVar13 = " ";
                }
                if (0 < emitter->nesting_depth) {
                  uVar12 = emitter->nesting_depth << (emitter->output != emitter_output_json);
                  *(undefined8 *)((long)&uStack_340 + lVar1) = 1;
                  uVar11 = (ulong)uVar12;
                  if ((int)uVar12 < 2) {
                    uVar11 = *(ulong *)((long)&uStack_340 + lVar1) & 0xffffffff;
                  }
                  do {
                    *(undefined8 *)((long)&uStack_340 + lVar1) = 0x1f2876;
                    emitter_printf(emitter,"%s",pcVar13);
                    uVar12 = (int)uVar11 - 1;
                    uVar11 = (ulong)uVar12;
                  } while (uVar12 != 0);
                }
              }
              *(undefined8 *)((long)&uStack_340 + lVar1) = 0x1f288c;
              emitter_printf(emitter,"}");
              *(undefined8 *)((long)&uStack_340 + lVar1) = 1;
              uVar11 = *(ulong *)((long)&uStack_340 + lVar1);
            }
            uVar12 = (uint)sz_13;
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 < uVar12);
      }
      if (emitter_output_json_compact < emitter->output) {
        return;
      }
      emitter->nesting_depth = emitter->nesting_depth + -1;
      emitter->item_at_depth = true;
      if (emitter->output != emitter_output_json_compact) {
        *(undefined8 *)((long)&uStack_340 + lVar1) = 0x1f28c3;
        emitter_printf(emitter,anon_var_dwarf_64382b4 + 8);
        pcVar13 = anon_var_dwarf_6438689 + 7;
        if (emitter->output != emitter_output_json) {
          pcVar13 = " ";
        }
        if (0 < emitter->nesting_depth) {
          uVar12 = emitter->nesting_depth << (emitter->output != emitter_output_json);
          uVar11 = uVar11 & 0xffffffff;
          if (1 < (int)uVar12) {
            uVar11 = (ulong)uVar12;
          }
          do {
            *(undefined8 *)((long)&uStack_340 + lVar1) = 0x1f2905;
            emitter_printf(emitter,"%s",pcVar13);
            uVar12 = (int)uVar11 - 1;
            uVar11 = (ulong)uVar12;
          } while (uVar12 != 0);
        }
      }
      *(undefined8 *)((long)&uStack_340 + lVar1) = 0x1f291b;
      emitter_printf(emitter,"}");
      return;
    }
  }
LAB_001f2a7d:
  pcVar13 = "<jemalloc>: Failure in xmallctlbymib()\n";
  puVar7 = puVar8;
LAB_001f2a6a:
  *(undefined8 *)(puVar7 + -8) = 0x1f2a6f;
  duckdb_je_malloc_write(pcVar13);
  *(undefined8 *)(puVar7 + -8) = 0x1f2a74;
  abort();
}

Assistant:

JEMALLOC_COLD
static void
stats_print_helper(emitter_t *emitter, bool merged, bool destroyed,
    bool unmerged, bool bins, bool large, bool mutex, bool extents, bool hpa) {
	/*
	 * These should be deleted.  We keep them around for a while, to aid in
	 * the transition to the emitter code.
	 */
	size_t allocated, active, metadata, metadata_edata, metadata_rtree,
	    metadata_thp, resident, mapped, retained;
	size_t num_background_threads;
	size_t zero_reallocs;
	uint64_t background_thread_num_runs, background_thread_run_interval;

	CTL_GET("stats.allocated", &allocated, size_t);
	CTL_GET("stats.active", &active, size_t);
	CTL_GET("stats.metadata", &metadata, size_t);
	CTL_GET("stats.metadata_edata", &metadata_edata, size_t);
	CTL_GET("stats.metadata_rtree", &metadata_rtree, size_t);
	CTL_GET("stats.metadata_thp", &metadata_thp, size_t);
	CTL_GET("stats.resident", &resident, size_t);
	CTL_GET("stats.mapped", &mapped, size_t);
	CTL_GET("stats.retained", &retained, size_t);

	CTL_GET("stats.zero_reallocs", &zero_reallocs, size_t);

	if (have_background_thread) {
		CTL_GET("stats.background_thread.num_threads",
		    &num_background_threads, size_t);
		CTL_GET("stats.background_thread.num_runs",
		    &background_thread_num_runs, uint64_t);
		CTL_GET("stats.background_thread.run_interval",
		    &background_thread_run_interval, uint64_t);
	} else {
		num_background_threads = 0;
		background_thread_num_runs = 0;
		background_thread_run_interval = 0;
	}

	/* Generic global stats. */
	emitter_json_object_kv_begin(emitter, "stats");
	emitter_json_kv(emitter, "allocated", emitter_type_size, &allocated);
	emitter_json_kv(emitter, "active", emitter_type_size, &active);
	emitter_json_kv(emitter, "metadata", emitter_type_size, &metadata);
	emitter_json_kv(emitter, "metadata_edata", emitter_type_size,
	    &metadata_edata);
	emitter_json_kv(emitter, "metadata_rtree", emitter_type_size,
	    &metadata_rtree);
	emitter_json_kv(emitter, "metadata_thp", emitter_type_size,
	    &metadata_thp);
	emitter_json_kv(emitter, "resident", emitter_type_size, &resident);
	emitter_json_kv(emitter, "mapped", emitter_type_size, &mapped);
	emitter_json_kv(emitter, "retained", emitter_type_size, &retained);
	emitter_json_kv(emitter, "zero_reallocs", emitter_type_size,
	    &zero_reallocs);

	emitter_table_printf(emitter, "Allocated: %zu, active: %zu, "
	    "metadata: %zu (n_thp %zu, edata %zu, rtree %zu), resident: %zu, "
	    "mapped: %zu, retained: %zu\n", allocated, active, metadata,
		metadata_thp, metadata_edata, metadata_rtree, resident, mapped,
	    retained);

	/* Strange behaviors */
	emitter_table_printf(emitter,
	    "Count of realloc(non-null-ptr, 0) calls: %zu\n", zero_reallocs);

	/* Background thread stats. */
	emitter_json_object_kv_begin(emitter, "background_thread");
	emitter_json_kv(emitter, "num_threads", emitter_type_size,
	    &num_background_threads);
	emitter_json_kv(emitter, "num_runs", emitter_type_uint64,
	    &background_thread_num_runs);
	emitter_json_kv(emitter, "run_interval", emitter_type_uint64,
	    &background_thread_run_interval);
	emitter_json_object_end(emitter); /* Close "background_thread". */

	emitter_table_printf(emitter, "Background threads: %zu, "
	    "num_runs: %"FMTu64", run_interval: %"FMTu64" ns\n",
	    num_background_threads, background_thread_num_runs,
	    background_thread_run_interval);

	if (mutex) {
		emitter_row_t row;
		emitter_col_t name;
		emitter_col_t col64[mutex_prof_num_uint64_t_counters];
		emitter_col_t col32[mutex_prof_num_uint32_t_counters];
		uint64_t uptime;

		emitter_row_init(&row);
		mutex_stats_init_cols(&row, "", &name, col64, col32);

		emitter_table_row(emitter, &row);
		emitter_json_object_kv_begin(emitter, "mutexes");

		CTL_M2_GET("stats.arenas.0.uptime", 0, &uptime, uint64_t);

		size_t stats_mutexes_mib[CTL_MAX_DEPTH];
		CTL_LEAF_PREPARE(stats_mutexes_mib, 0, "stats.mutexes");
		for (int i = 0; i < mutex_prof_num_global_mutexes; i++) {
			mutex_stats_read_global(stats_mutexes_mib, 2,
			    global_mutex_names[i], &name, col64, col32, uptime);
			emitter_json_object_kv_begin(emitter, global_mutex_names[i]);
			mutex_stats_emit(emitter, &row, col64, col32);
			emitter_json_object_end(emitter);
		}

		emitter_json_object_end(emitter); /* Close "mutexes". */
	}

	emitter_json_object_end(emitter); /* Close "stats". */

	if (merged || destroyed || unmerged) {
		unsigned narenas;

		emitter_json_object_kv_begin(emitter, "stats.arenas");

		CTL_GET("arenas.narenas", &narenas, unsigned);
		size_t mib[3];
		size_t miblen = sizeof(mib) / sizeof(size_t);
		size_t sz;
		VARIABLE_ARRAY_UNSAFE(bool, initialized, narenas);
		bool destroyed_initialized;
		unsigned i, ninitialized;

		xmallctlnametomib("arena.0.initialized", mib, &miblen);
		for (i = ninitialized = 0; i < narenas; i++) {
			mib[1] = i;
			sz = sizeof(bool);
			xmallctlbymib(mib, miblen, &initialized[i], &sz,
			    NULL, 0);
			if (initialized[i]) {
				ninitialized++;
			}
		}
		mib[1] = MALLCTL_ARENAS_DESTROYED;
		sz = sizeof(bool);
		xmallctlbymib(mib, miblen, &destroyed_initialized, &sz,
		    NULL, 0);

		/* Merged stats. */
		if (merged && (ninitialized > 1 || !unmerged)) {
			/* Print merged arena stats. */
			emitter_table_printf(emitter, "Merged arenas stats:\n");
			emitter_json_object_kv_begin(emitter, "merged");
			stats_arena_print(emitter, MALLCTL_ARENAS_ALL, bins,
			    large, mutex, extents, hpa);
			emitter_json_object_end(emitter); /* Close "merged". */
		}

		/* Destroyed stats. */
		if (destroyed_initialized && destroyed) {
			/* Print destroyed arena stats. */
			emitter_table_printf(emitter,
			    "Destroyed arenas stats:\n");
			emitter_json_object_kv_begin(emitter, "destroyed");
			stats_arena_print(emitter, MALLCTL_ARENAS_DESTROYED,
			    bins, large, mutex, extents, hpa);
			emitter_json_object_end(emitter); /* Close "destroyed". */
		}

		/* Unmerged stats. */
		if (unmerged) {
			for (i = 0; i < narenas; i++) {
				if (initialized[i]) {
					char arena_ind_str[20];
					malloc_snprintf(arena_ind_str,
					    sizeof(arena_ind_str), "%u", i);
					emitter_json_object_kv_begin(emitter,
					    arena_ind_str);
					emitter_table_printf(emitter,
					    "arenas[%s]:\n", arena_ind_str);
					stats_arena_print(emitter, i, bins,
					    large, mutex, extents, hpa);
					/* Close "<arena-ind>". */
					emitter_json_object_end(emitter);
				}
			}
		}
		emitter_json_object_end(emitter); /* Close "stats.arenas". */
	}
}